

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindLinearRoot.cpp
# Opt level: O3

void GeoCalcs::FindLinearRoot(double *x,double *errArray,double *root)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ulong uVar4;
  double dVar5;
  
  dVar5 = *x;
  dVar1 = x[1];
  if ((dVar5 != dVar1) || (NAN(dVar5) || NAN(dVar1))) {
    dVar2 = *errArray;
    dVar3 = errArray[1];
    if ((dVar2 != dVar3) || (NAN(dVar2) || NAN(dVar3))) {
      dVar5 = dVar5 - ((dVar1 - dVar5) * dVar2) / (dVar3 - dVar2);
    }
    else {
      uVar4 = -(ulong)(ABS(dVar2 - dVar3) < 1e-15);
      dVar5 = (double)(~uVar4 & 0x7ff4000000000000 | (ulong)dVar5 & uVar4);
    }
  }
  else {
    dVar5 = NAN;
  }
  *root = dVar5;
  return;
}

Assistant:

void FindLinearRoot(double *x, double *errArray, double &root)
    {
        if (x[0] == x[1])
        {
            root = std::numeric_limits<double>::signaling_NaN();
        }
        else if (errArray[0] == errArray[1])
        {
            if (IsNearZero(errArray[0] - errArray[1], 1e-15))
            {
                root = x[0];
            }
            else
            {
                root = numeric_limits<double>::signaling_NaN();
            }
        }
        else
        {
            root = -errArray[0] * (x[1] - x[0]) / (errArray[1] - errArray[0]) + x[0];
        }
    }